

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O1

boolean destroy_item(int osym,int dmgtyp)

{
  short sVar1;
  obj *poVar2;
  bool bVar3;
  boolean bVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  long lVar9;
  ushort uVar10;
  long lVar11;
  int iVar12;
  obj *obj;
  uint uVar13;
  char *pcVar14;
  bool bVar15;
  
  if (dmgtyp == 2) {
    if ((u.uprops[1].intrinsic == 0 && u.uprops[1].extrinsic == 0) &&
       ((youmonst.mintrinsics & 1) == 0)) goto LAB_002993a9;
    if ((u.uprops[1].intrinsic >> 0x1a & 1) == 0) {
      return '\0';
    }
    if ((u.uprops[1].intrinsic & 0xfbffffff) != 0 || u.uprops[1].extrinsic != 0) {
      return '\0';
    }
    uVar10 = youmonst.mintrinsics & 1;
  }
  else if (dmgtyp == 6) {
    if ((u.uprops[5].intrinsic == 0 && u.uprops[5].extrinsic == 0) &&
       ((youmonst.mintrinsics & 0x10) == 0)) goto LAB_002993a9;
    if ((u.uprops[5].intrinsic >> 0x1a & 1) == 0) {
      return '\0';
    }
    if ((u.uprops[5].intrinsic & 0xfbffffff) != 0 || u.uprops[5].extrinsic != 0) {
      return '\0';
    }
    uVar10 = youmonst.mintrinsics & 0x10;
  }
  else {
    if ((dmgtyp != 3) ||
       ((u.uprops[2].intrinsic == 0 && u.uprops[2].extrinsic == 0 &&
        ((youmonst.mintrinsics & 2) == 0)))) goto LAB_002993a9;
    if ((u.uprops[2].intrinsic >> 0x1a & 1) == 0) {
      return '\0';
    }
    if ((u.uprops[2].intrinsic & 0xfbffffff) != 0 || u.uprops[2].extrinsic != 0) {
      return '\0';
    }
    uVar10 = youmonst.mintrinsics & 2;
  }
  if (uVar10 != 0) {
    return '\0';
  }
LAB_002993a9:
  if (uarmc == (obj *)0x0) {
    bVar15 = true;
  }
  else {
    bVar15 = uarmc->otyp != 0x84;
  }
  if (invent == (obj *)0x0) {
    return '\0';
  }
  uVar13 = 0xf;
  if (bVar15) {
    uVar13 = 3;
  }
  bVar4 = '\0';
  obj = invent;
  do {
    poVar2 = obj->nobj;
    if ((((obj->oclass == osym) && (obj->oartifact == '\0')) &&
        (((obj->field_0x4c & 0x80) == 0 || (obj->quan != 1)))) &&
       ((bVar15 || (uVar5 = mt_random(), uVar5 * -0x33333333 < 0x33333334)))) {
      if (dmgtyp == 2) {
        if (((u.uprops[1].intrinsic == 0 && u.uprops[1].extrinsic == 0) &&
            ((youmonst.mintrinsics & 1) == 0)) ||
           (((u.uprops[1].intrinsic >> 0x1a & 1) != 0 &&
            (((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0 &&
             ((youmonst.mintrinsics & 1) == 0)))))) {
          uVar10 = 0;
        }
        else {
          uVar10 = (ushort)(obj->oclass != '\b');
        }
        sVar1 = obj->otyp;
        if (sVar1 == 0x1bd) {
          if (((u.uprops[0x1e].intrinsic == 0) &&
              (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
               (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
             ((bVar3 = true, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
            pcVar14 = xname(obj);
            pcVar14 = The(pcVar14);
            pcVar8 = hcolor("dark red");
            pline("%s glows a strange %s, but remains intact.",pcVar14,pcVar8);
            bVar3 = true;
          }
        }
        else {
          bVar3 = sVar1 == 0x162 || sVar1 == 0x17f;
        }
        lVar9 = (long)obj->quan;
        uVar5 = 1;
        if (osym == 10) {
          iVar12 = 3;
        }
        else if (osym == 9) {
          iVar12 = 2;
        }
        else if (osym == 8) {
          uVar5 = mt_random();
          uVar5 = uVar5 % 6 + 1;
          iVar12 = 1;
        }
        else {
          iVar12 = 0;
          bVar3 = true;
          uVar5 = 0;
        }
        if (bVar3) {
LAB_00299731:
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if ((((u.uprops[1].intrinsic >> 0x1a & 1) != 0) &&
              ((u.uprops[1].intrinsic & 0xfbffffff) == 0 && u.uprops[1].extrinsic == 0)) &&
             (((youmonst.mintrinsics & 1) == 0 && (obj->oclass != '\b')))) {
LAB_00299870:
            bVar3 = true;
            uVar5 = uVar5 + 1 >> 1;
          }
        }
      }
      else if (dmgtyp == 6) {
        if ((((u.uprops[5].intrinsic != 0 || u.uprops[5].extrinsic != 0) ||
             (uVar10 = 0, (youmonst.mintrinsics & 0x10) != 0)) &&
            (uVar10 = 1, (u.uprops[5].intrinsic >> 0x1a & 1) != 0)) &&
           ((u.uprops[5].intrinsic & 0xfbffffff) == 0 && u.uprops[5].extrinsic == 0)) {
          uVar10 = youmonst.mintrinsics >> 4 & 1;
        }
        bVar3 = false;
        lVar9 = (long)obj->quan;
        iVar12 = 0;
        uVar5 = 0;
        if (osym == 0xb) {
          bVar3 = false;
          iVar12 = 0;
          if (obj->otyp != 0x1d5) {
            uVar5 = mt_random();
            uVar5 = uVar5 % 10 + 1;
            iVar12 = 4;
            bVar3 = true;
          }
        }
        if (!bVar3) goto LAB_00299731;
        bVar3 = true;
        if ((((u.uprops[5].intrinsic >> 0x1a & 1) != 0) &&
            ((u.uprops[5].intrinsic & 0xfbffffff) == 0 && u.uprops[5].extrinsic == 0)) &&
           ((youmonst.mintrinsics & 0x10) == 0)) goto LAB_00299870;
      }
      else if (((dmgtyp == 3) && (osym == 8)) && (obj->otyp != 0x142)) {
        lVar9 = (long)obj->quan;
        uVar5 = mt_random();
        uVar10 = 0;
        uVar5 = (uVar5 & 3) + 1;
        bVar3 = true;
        iVar12 = 0;
      }
      else {
        uVar10 = 0;
        bVar3 = false;
        lVar9 = 0;
        iVar12 = 0;
        uVar5 = 0;
      }
      if (bVar3) {
        lVar7 = (long)((*(int *)&obj->field_0x4a << 8) >> 0x1f);
        lVar11 = lVar9 + lVar7;
        if (lVar11 == 0 || SCARRY8(lVar9,lVar7) != lVar11 < 0) {
          lVar9 = 0;
        }
        else {
          lVar9 = 0;
          lVar7 = lVar11;
          do {
            uVar6 = mt_random();
            lVar9 = lVar9 + (ulong)(uVar6 % uVar13 == 0);
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        if (lVar9 != 0) {
          pcVar14 = "Some of your";
          if (lVar9 == 1) {
            pcVar14 = "One of your";
          }
          if (lVar9 == lVar11) {
            pcVar14 = "Your";
          }
          pcVar8 = xname(obj);
          pline("%s %s %s!",pcVar14,pcVar8,destroy_strings[(uint)(1 < lVar9) + iVar12 * 3]);
          if ((dmgtyp != 3 && osym == 8) && ((~(youmonst.data)->mflags1 & 0x1400) != 0)) {
            potionbreathe(obj);
          }
          if (obj->owornmask != 0) {
            if ((obj->owornmask & 0x60000U) == 0) {
              setnotworn(obj);
            }
            else {
              Ring_gone(obj);
            }
          }
          if (obj == current_wand) {
            current_wand = (obj *)0x0;
          }
          lVar7 = lVar9;
          if (0 < lVar9) {
            do {
              useup(obj);
              lVar7 = lVar7 + -1;
            } while (lVar7 != 0);
          }
          bVar4 = '\x01';
          if (uVar5 != 0) {
            if (uVar10 == 0) {
              pcVar14 = destroy_strings[(ulong)(uint)(iVar12 * 3) + 2];
              if (lVar9 != 1) {
                pcVar14 = makeplural(pcVar14);
              }
              losehp(uVar5,pcVar14,(uint)(lVar9 != 1));
              exercise(0,'\0');
            }
            else {
              pline("You aren\'t hurt!");
            }
          }
        }
      }
    }
    obj = poVar2;
    if (poVar2 == (obj *)0x0) {
      return bVar4;
    }
  } while( true );
}

Assistant:

boolean destroy_item(int osym, int dmgtyp)
{
	struct obj *obj, *obj2;
	int dmg, xresist, skip;
	long i, cnt, quan;
	int dindx;
	const char *mult;
	boolean seen_destroy = FALSE;
	boolean cloak_protect;

	/* elemental immunities prevent item destruction */
	if ((dmgtyp == AD_COLD && FCold_resistance) ||
	    (dmgtyp == AD_FIRE && FFire_resistance) ||
	    (dmgtyp == AD_ELEC && FShock_resistance))
	    return FALSE;

	/* cloak of protection prevents 80% of item destruction */
	cloak_protect = (uarmc && uarmc->otyp == CLOAK_OF_PROTECTION);

	for (obj = invent; obj; obj = obj2) {
	    obj2 = obj->nobj;
	    if (obj->oclass != osym) continue; /* test only objs of type osym */
	    if (obj->oartifact) continue; /* don't destroy artifacts */
	    if (obj->in_use && obj->quan == 1) continue; /* not available */
	    if (cloak_protect && rn2(5)) continue;
	    xresist = skip = 0;
	    dmg = dindx = 0;
	    quan = 0L;

	    switch(dmgtyp) {
		case AD_COLD:
		    if (osym == POTION_CLASS && obj->otyp != POT_OIL) {
			quan = obj->quan;
			dindx = 0;
			dmg = rnd(4);
		    } else skip++;
		    break;
		case AD_FIRE:
		    xresist = (FFire_resistance && obj->oclass != POTION_CLASS);

		    if (obj->otyp == SCR_FIRE || obj->otyp == SPE_FIREBALL)
			skip++;
		    if (obj->otyp == SPE_BOOK_OF_THE_DEAD) {
			skip++;
			if (!Blind)
			    pline("%s glows a strange %s, but remains intact.",
				The(xname(obj)), hcolor("dark red"));
		    }
		    quan = obj->quan;
		    switch(osym) {
			case POTION_CLASS:
			    dindx = 1;
			    dmg = rnd(6);
			    break;
			case SCROLL_CLASS:
			    dindx = 2;
			    dmg = 1;
			    break;
			case SPBOOK_CLASS:
			    dindx = 3;
			    dmg = 1;
			    break;
			default:
			    skip++;
			    break;
		    }
		    /* Partial fire resistance only helps if full fire immunity
		     * would have helped otherwise. */
		    if (!skip && PFire_resistance && obj->oclass != POTION_CLASS)
			dmg = (dmg + 1) / 2;
		    break;
		case AD_ELEC:
		    xresist = FShock_resistance;
		    quan = obj->quan;
		    switch(osym) {
			case WAND_CLASS:
			    if (obj->otyp == WAN_LIGHTNING) { skip++; break; }
			    dindx = 4;
			    dmg = rnd(10);
			    break;
			default:
			    skip++;
			    break;
		    }
		    /* Partial shock resistance only helps if full shock resistance
		     * would have helped otherwise. */
		    if (!skip && PShock_resistance)
			dmg = (dmg + 1) / 2;
		    break;
		default:
		    skip++;
		    break;
	    }
	    if (!skip) {
		if (obj->in_use) --quan; /* one will be used up elsewhere */
		for (i = cnt = 0L; i < quan; i++)
		    if (!rn2(cloak_protect ? 15 : 3)) cnt++;

		if (!cnt) continue;
		seen_destroy = TRUE;
		if (cnt == quan)	mult = "Your";
		else	mult = (cnt == 1L) ? "One of your" : "Some of your";
		pline("%s %s %s!", mult, xname(obj),
			(cnt > 1L) ? destroy_strings[dindx*3 + 1]
				  : destroy_strings[dindx*3]);
		if (osym == POTION_CLASS && dmgtyp != AD_COLD) {
		    if (!breathless(youmonst.data) || haseyes(youmonst.data))
		    	potionbreathe(obj);
		}
		if (obj->owornmask) {
		    if (obj->owornmask & W_RING) /* ring being worn */
			Ring_gone(obj);
		    else
			setnotworn(obj);
		}
		if (obj == current_wand) current_wand = 0;	/* destroyed */
		for (i = 0; i < cnt; i++)
		    useup(obj);
		if (dmg) {
		    if (xresist)	pline("You aren't hurt!");
		    else {
			const char *how = destroy_strings[dindx * 3 + 2];
			boolean one = (cnt == 1L);

			losehp(dmg, one ? how : (const char *)makeplural(how),
			       one ? KILLED_BY_AN : KILLED_BY);
			exercise(A_STR, FALSE);
		    }
		}
	    }
	}

	return seen_destroy;
}